

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

word Dau_Dsd6ToTruth_rec(char *pStr,char **p,int *pMatches,word *pTruths)

{
  char cVar1;
  char cVar2;
  int nVars;
  word wVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  bool bVar12;
  word Temp [3];
  word Fanins [6];
  word local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  word local_68 [7];
  
  cVar1 = **p;
  if (cVar1 == '!') {
    *p = *p + 1;
  }
  pcVar10 = *p;
  cVar2 = *pcVar10;
  if ((byte)(cVar2 + 0x9fU) < 6) {
    return -(ulong)(cVar1 == '!') ^ pTruths[(int)cVar2 - 0x61];
  }
  if (cVar2 == '[') {
    iVar7 = pMatches[(long)pcVar10 - (long)pStr];
    if (pStr[iVar7] != ']') {
      __assert_fail("**p == \'[\' && *q == \']\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x179,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
    }
    pcVar10 = pcVar10 + 1;
    *p = pcVar10;
    uVar8 = 0;
    while (pcVar10 < pStr + iVar7) {
      wVar3 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
      uVar8 = uVar8 ^ wVar3;
      pcVar10 = *p + 1;
      *p = pcVar10;
    }
    if (pcVar10 != pStr + iVar7) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x17c,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
    }
  }
  else {
    if (cVar2 == '<') {
      lVar9 = (long)pcVar10 - (long)pStr;
      lVar4 = (long)pMatches[lVar9];
      iVar7 = 0;
      if (pStr[lVar4 + 1] == '{') {
        pcVar11 = pStr + lVar4 + 1;
        *p = pcVar11;
        if ((*pcVar11 != '{') ||
           (pcVar11 = pStr + pMatches[(long)pcVar11 - (long)pStr], *pcVar11 != '}')) {
          __assert_fail("**p == \'{\' && *q2 == \'}\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                        ,0x18c,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
        }
        pcVar5 = pStr + lVar4 + 2;
        *p = pcVar5;
        lVar4 = 0;
        if (pcVar5 < pcVar11) {
          lVar4 = 0;
          local_70 = lVar9;
          do {
            wVar3 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
            local_68[lVar4] = wVar3;
            pcVar5 = *p + 1;
            *p = pcVar5;
            lVar4 = lVar4 + 1;
            lVar9 = local_70;
          } while (pcVar5 < pcVar11);
        }
        iVar7 = (int)lVar4;
        if (pcVar5 != pcVar11) {
          __assert_fail("*p == q2",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                        ,399,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
        }
        pTruths = local_68;
      }
      *p = pcVar10;
      if ((*pcVar10 != '<') || (pcVar11 = pStr + pMatches[lVar9], *pcVar11 != '>')) {
        __assert_fail("**p == \'<\' && *q == \'>\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x197,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      if (iVar7 != 0) {
        for (; pcVar10 < pcVar11; pcVar10 = pcVar10 + 1) {
          if (((byte)(*pcVar10 + 0x9fU) < 0x1a) && (iVar7 <= *pcVar10 + -0x61)) {
            __assert_fail("*pOld - \'a\' < nVars",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                          ,0x19c,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
          }
        }
      }
      pcVar5 = *p;
      pcVar10 = pcVar5 + 1;
      *p = pcVar10;
      if (pcVar10 < pcVar11) {
        lVar9 = 0;
        do {
          wVar3 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
          *(word *)((long)&local_88 + lVar9) = wVar3;
          lVar9 = lVar9 + 8;
          pcVar5 = *p;
          pcVar10 = pcVar5 + 1;
          *p = pcVar10;
        } while (pcVar10 < pcVar11);
        bVar12 = lVar9 == 0x18;
      }
      else {
        bVar12 = false;
      }
      if (bVar12) {
        if (pcVar10 != pcVar11) {
          __assert_fail("*p == q",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                        ,0x1a1,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
        }
        if (pcVar11[1] == '{') {
          *p = pcVar5 + 2;
          if ((pcVar5[2] != '{') || (pStr[pMatches[(long)(pcVar5 + 2) - (long)pStr]] != '}')) {
            __assert_fail("**p == \'{\' && *q == \'}\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                          ,0x1a5,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
          }
          *p = pStr + pMatches[(long)(pcVar5 + 2) - (long)pStr];
        }
        return -(ulong)(cVar1 == '!') ^ local_78 ^ (local_80 ^ local_78) & local_88;
      }
      __assert_fail("pTemp == Temp + 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x1a0,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
    }
    if (cVar2 != '(') {
      if (5 < (byte)(cVar2 + 0xbfU) && 9 < (byte)(cVar2 - 0x30U)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x1ba,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      nVars = Abc_TtReadHex(&local_88,pcVar10);
      iVar7 = 1 << ((char)nVars - 2U & 0x1f);
      if (nVars < 3) {
        iVar7 = 1;
      }
      pcVar11 = *p;
      pcVar10 = pcVar11 + iVar7;
      *p = pcVar10;
      if ((pcVar11[iVar7] != '{') ||
         (pcVar11 = pStr + pMatches[(long)pcVar10 - (long)pStr], *pcVar11 != '}')) {
        __assert_fail("**p == \'{\' && *q == \'}\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x1b2,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      pcVar10 = pcVar10 + 1;
      *p = pcVar10;
      lVar9 = 0;
      if (pcVar10 < pcVar11) {
        lVar9 = 0;
        do {
          wVar3 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
          local_68[lVar9] = wVar3;
          pcVar10 = *p + 1;
          *p = pcVar10;
          lVar9 = lVar9 + 1;
        } while (pcVar10 < pcVar11);
      }
      if ((int)lVar9 != nVars) {
        __assert_fail("i == nVars",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x1b5,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      if (pcVar10 != pcVar11) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x1b6,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      uVar6 = Dau_Dsd6TruthCompose_rec(local_88,local_68,nVars);
      uVar8 = -(ulong)(cVar1 == '!');
      goto LAB_004b2d59;
    }
    iVar7 = pMatches[(long)pcVar10 - (long)pStr];
    if (pStr[iVar7] != ')') {
      __assert_fail("**p == \'(\' && *q == \')\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x16f,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
    }
    pcVar10 = pcVar10 + 1;
    *p = pcVar10;
    uVar8 = 0xffffffffffffffff;
    while (pcVar10 < pStr + iVar7) {
      wVar3 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
      uVar8 = uVar8 & wVar3;
      pcVar10 = *p + 1;
      *p = pcVar10;
    }
    if (pcVar10 != pStr + iVar7) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x172,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
    }
  }
  uVar6 = -(ulong)(cVar1 == '!');
LAB_004b2d59:
  return uVar8 ^ uVar6;
}

Assistant:

word Dau_Dsd6ToTruth_rec( char * pStr, char ** p, int * pMatches, word * pTruths )
{
    int fCompl = 0;
    if ( **p == '!' )
        (*p)++, fCompl = 1;
    if ( **p >= 'a' && **p <= 'f' ) // var
    {
        assert( **p - 'a' >= 0 && **p - 'a' < 6 );
        return fCompl ? ~pTruths[**p - 'a'] : pTruths[**p - 'a'];
    }
    if ( **p == '(' ) // and/or
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word Res = ~(word)0;
        assert( **p == '(' && *q == ')' );
        for ( (*p)++; *p < q; (*p)++ )
            Res &= Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths );
        assert( *p == q );
        return fCompl ? ~Res : Res;
    }
    if ( **p == '[' ) // xor
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word Res = 0;
        assert( **p == '[' && *q == ']' );
        for ( (*p)++; *p < q; (*p)++ )
            Res ^= Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths );
        assert( *p == q );
        return fCompl ? ~Res : Res;
    }
    if ( **p == '<' ) // mux
    {
        int nVars = 0;
        word Temp[3], * pTemp = Temp, Res;
        word Fanins[6], * pTruths2;
        char * pOld = *p;
        char * q = pStr + pMatches[ *p - pStr ];
        // read fanins
        if ( *(q+1) == '{' )
        {
            char * q2;
            *p = q+1;
            q2 = pStr + pMatches[ *p - pStr ];
            assert( **p == '{' && *q2 == '}' );
            for ( nVars = 0, (*p)++; *p < q2; (*p)++, nVars++ )
                Fanins[nVars] = Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths );
            assert( *p == q2 );
            pTruths2 = Fanins;
        }
        else
            pTruths2 = pTruths;
        // read MUX
        *p = pOld;
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '<' && *q == '>' );
        // verify internal variables
        if ( nVars )
            for ( ; pOld < q; pOld++ )
                if ( *pOld >= 'a' && *pOld <= 'z' )
                    assert( *pOld - 'a' < nVars );
        // derive MAX components
        for ( (*p)++; *p < q; (*p)++ )
            *pTemp++ = Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths2 );
        assert( pTemp == Temp + 3 );
        assert( *p == q );
        if ( *(q+1) == '{' ) // and/or
        {
            char * q = pStr + pMatches[ ++(*p) - pStr ];
            assert( **p == '{' && *q == '}' );
            *p = q;
        }
        Res = (Temp[0] & Temp[1]) | (~Temp[0] & Temp[2]);
        return fCompl ? ~Res : Res;
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        word Func, Fanins[6], Res;
        char * q;
        int i, nVars = Abc_TtReadHex( &Func, *p );
        *p += Abc_TtHexDigitNum( nVars );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Fanins[i] = Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths );
        assert( i == nVars );
        assert( *p == q );
        Res = Dau_Dsd6TruthCompose_rec( Func, Fanins, nVars );
        return fCompl ? ~Res : Res;
    }
    assert( 0 );
    return 0;
}